

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,string *config,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  cmGeneratorTarget *this_00;
  cmGeneratorTarget *t;
  bool bVar1;
  TargetType TVar2;
  cmListFileBacktrace local_78;
  cmLinkItem local_68;
  
  this_00 = dependee_name->Target;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    t = (this->Targets).
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start[depender_index];
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if ((TVar2 == EXECUTABLE) &&
       (bVar1 = cmGeneratorTarget::IsExecutableWithExports(this_00), !bVar1)) {
      return;
    }
    local_78.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmLinkItem::cmLinkItem(&local_68,t,&local_78);
    std::
    _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
    ::_M_insert_unique<cmLinkItem>(&emitted->_M_t,&local_68);
    if (local_68.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.String._M_dataplus._M_p != &local_68.String.field_2) {
      operator_delete(local_68.String._M_dataplus._M_p,
                      local_68.String.field_2._M_allocated_capacity + 1);
    }
    if (local_78.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    AddInterfaceDepends(this,depender_index,this_00,&dependee_name->Backtrace,config,emitted);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  int depender_index, cmLinkItem const& dependee_name,
  const std::string& config, std::set<cmLinkItem>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  cmGeneratorTarget const* dependee = dependee_name.Target;
  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (dependee && dependee->GetType() == cmStateEnums::EXECUTABLE &&
      !dependee->IsExecutableWithExports()) {
    dependee = nullptr;
  }

  if (dependee) {
    // A target should not depend on itself.
    emitted.insert(cmLinkItem(depender, cmListFileBacktrace()));
    this->AddInterfaceDepends(depender_index, dependee,
                              dependee_name.Backtrace, config, emitted);
  }
}